

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O2

int iniparser_getnsec(dictionary *d)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if (d == (dictionary *)0x0) {
    iVar2 = -1;
  }
  else {
    lVar3 = 0;
    lVar4 = d->size;
    if (d->size < 1) {
      lVar4 = lVar3;
    }
    iVar2 = 0;
    for (; lVar4 != lVar3; lVar3 = lVar3 + 1) {
      if (d->key[lVar3] != (char *)0x0) {
        pcVar1 = strchr(d->key[lVar3],0x3a);
        iVar2 = iVar2 + (uint)(pcVar1 == (char *)0x0);
      }
    }
  }
  return iVar2;
}

Assistant:

int iniparser_getnsec(const dictionary * d)
{
    int i ;
    int nsec ;

    if (d == NULL) return -1 ;
    nsec = 0 ;
    for (i = 0 ; i < d->size ; i++) {
        if (d->key[i] == NULL)
            continue ;
        if (strchr(d->key[i], ':') == NULL) {
            nsec ++ ;
        }
    }
    return nsec ;
}